

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O0

Result __thiscall wabt::FileStream::WriteDataImpl(FileStream *this,size_t at,void *data,size_t size)

{
  FILE *pFVar1;
  int iVar2;
  uint *puVar3;
  size_t sVar4;
  size_t size_local;
  void *data_local;
  size_t at_local;
  FileStream *this_local;
  
  if (this->file_ == (FILE *)0x0) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else if (size == 0) {
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    if (at != this->offset_) {
      iVar2 = fseek((FILE *)this->file_,at,0);
      pFVar1 = _stderr;
      if (iVar2 != 0) {
        puVar3 = (uint *)__errno_location();
        fprintf(pFVar1,"%s:%d: fseek offset=%zd failed, errno=%d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/stream.cc"
                ,0x11c,size,(ulong)*puVar3);
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
      this->offset_ = at;
    }
    sVar4 = fwrite(data,size,1,(FILE *)this->file_);
    pFVar1 = _stderr;
    if (sVar4 == 1) {
      this->offset_ = size + this->offset_;
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
    else {
      puVar3 = (uint *)__errno_location();
      fprintf(pFVar1,"%s:%d: fwrite size=%zd failed, errno=%d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/stream.cc",
              0x122,size,(ulong)*puVar3);
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result FileStream::WriteDataImpl(size_t at, const void* data, size_t size) {
  if (!file_) {
    return Result::Error;
  }
  if (size == 0) {
    return Result::Ok;
  }
  if (at != offset_) {
    if (fseek(file_, at, SEEK_SET) != 0) {
      ERROR("fseek offset=%" PRIzd " failed, errno=%d\n", size, errno);
      return Result::Error;
    }
    offset_ = at;
  }
  if (fwrite(data, size, 1, file_) != 1) {
    ERROR("fwrite size=%" PRIzd " failed, errno=%d\n", size, errno);
    return Result::Error;
  }
  offset_ += size;
  return Result::Ok;
}